

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

int GmfSetLin(int64_t MshIdx,int KwdCod,...)

{
  double dVar1;
  char cVar2;
  uint uVar3;
  char in_AL;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  void **ppvVar7;
  long in_RCX;
  long lVar8;
  long lVar9;
  uint *in_RDX;
  uint *puVar10;
  char *pcVar11;
  FILE *pFVar12;
  int iVar13;
  uint *in_R8;
  undefined8 in_R9;
  uint *puVar14;
  ulong uVar15;
  undefined4 *puVar16;
  undefined4 in_XMM0_Da;
  undefined4 uVar17;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list VarArg;
  undefined8 local_118;
  void **local_110;
  void *local_e8 [2];
  uint *local_d8;
  long local_d0;
  uint *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (KwdCod < 0) {
    KwdCod = -KwdCod;
    puVar16 = (undefined4 *)(MshIdx + (ulong)(uint)KwdCod * 0x3300 + 0x110);
    uVar17 = 5;
  }
  else {
    puVar16 = (undefined4 *)(MshIdx + (ulong)(uint)KwdCod * 0x3300 + 0x110);
    uVar17 = *puVar16;
  }
  if (KwdCod - 0xf1U < 0xffffff10) {
    return 0;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar4 = _setjmp((__jmp_buf_tag *)(MshIdx + 0x48));
  if (iVar4 != 0) {
    return 0;
  }
  iVar4 = _setjmp((__jmp_buf_tag *)(MshIdx + 0x48));
  puVar14 = local_c8;
  lVar8 = local_d0;
  puVar10 = local_d8;
  if (iVar4 != 0) {
    return 0;
  }
  local_110 = &VarArg[0].overflow_arg_area;
  local_118 = 0x3000000010;
  switch(uVar17) {
  case 1:
  case 2:
  case 4:
    if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
      if (0 < (int)puVar16[3]) {
        lVar8 = 0;
        do {
          cVar2 = *(char *)((long)puVar16 + lVar8 + 0xfd8);
          if (cVar2 == 'c') {
            uVar5 = local_118 & 0xffffffff;
            if (uVar5 < 0x29) {
              local_118 = CONCAT44(local_118._4_4_,(uint)local_118 + 8);
              ppvVar7 = (void **)((long)local_e8 + uVar5);
            }
            else {
              ppvVar7 = local_110;
              local_110 = local_110 + 1;
            }
            pcVar11 = (char *)*ppvVar7;
            sVar6 = strlen(pcVar11);
            if (0x3f < sVar6) {
              pcVar11[0x40] = '\0';
            }
            fputs(pcVar11,*(FILE **)(MshIdx + 0x300410));
          }
          else if (cVar2 == 'i') {
            uVar5 = local_118 & 0xffffffff;
            if (*(int *)(MshIdx + 4) < 4) {
              if ((uint)local_118 < 0x29) {
                local_118 = CONCAT44(local_118._4_4_,(uint)local_118 + 8);
                ppvVar7 = (void **)((long)local_e8 + uVar5);
              }
              else {
                ppvVar7 = local_110;
                local_110 = local_110 + 1;
              }
              fprintf(*(FILE **)(MshIdx + 0x300410),"%d ",(ulong)*(uint *)ppvVar7);
            }
            else {
              if ((uint)local_118 < 0x29) {
                local_118 = CONCAT44(local_118._4_4_,(uint)local_118 + 8);
                ppvVar7 = (void **)((long)local_e8 + uVar5);
              }
              else {
                ppvVar7 = local_110;
                local_110 = local_110 + 1;
              }
              fprintf(*(FILE **)(MshIdx + 0x300410),"%ld ",*ppvVar7);
            }
          }
          else if (cVar2 == 'r') {
            if (*(int *)(MshIdx + 0x18) == 0x20) {
              uVar5 = (ulong)local_118._4_4_;
              if (uVar5 < 0xa1) {
                local_118 = CONCAT44(local_118._4_4_ + 0x10,(uint)local_118);
                ppvVar7 = (void **)((long)local_e8 + uVar5);
              }
              else {
                ppvVar7 = local_110;
                local_110 = local_110 + 1;
              }
              pFVar12 = *(FILE **)(MshIdx + 0x300410);
              uVar17 = SUB84(*ppvVar7,0);
              pcVar11 = "%.9g ";
            }
            else {
              uVar5 = (ulong)local_118._4_4_;
              if (uVar5 < 0xa1) {
                local_118 = CONCAT44(local_118._4_4_ + 0x10,(uint)local_118);
                ppvVar7 = (void **)((long)local_e8 + uVar5);
              }
              else {
                ppvVar7 = local_110;
                local_110 = local_110 + 1;
              }
              pFVar12 = *(FILE **)(MshIdx + 0x300410);
              uVar17 = SUB84(*ppvVar7,0);
              pcVar11 = "%.17g ";
            }
            fprintf(pFVar12,pcVar11,uVar17);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)puVar16[3]);
      }
      goto switchD_00109489_default;
    }
    if (0 < (int)puVar16[3]) {
      lVar8 = 0;
      iVar4 = 0;
      do {
        cVar2 = *(char *)((long)puVar16 + lVar8 + 0xfd8);
        if (cVar2 == 'c') {
          memset((void *)(*(long *)(MshIdx + 0x300428) + (long)iVar4),0,0x100);
          uVar5 = local_118 & 0xffffffff;
          if (uVar5 < 0x29) {
            local_118 = CONCAT44(local_118._4_4_,(uint)local_118 + 8);
            ppvVar7 = (void **)((long)local_e8 + uVar5);
          }
          else {
            ppvVar7 = local_110;
            local_110 = local_110 + 1;
          }
          strncpy((char *)(*(long *)(MshIdx + 0x300428) + (long)iVar4),(char *)*ppvVar7,0x100);
          iVar4 = iVar4 + 0x40;
        }
        else if (cVar2 == 'i') {
          uVar5 = local_118 & 0xffffffff;
          if (*(int *)(MshIdx + 4) < 4) {
            if ((uint)local_118 < 0x29) {
              local_118 = CONCAT44(local_118._4_4_,(uint)local_118 + 8);
              ppvVar7 = (void **)((long)local_e8 + uVar5);
            }
            else {
              ppvVar7 = local_110;
              local_110 = local_110 + 1;
            }
            *(undefined4 *)(*(long *)(MshIdx + 0x300428) + (long)iVar4) = *(undefined4 *)ppvVar7;
            goto LAB_0010960b;
          }
          if ((uint)local_118 < 0x29) {
            local_118 = CONCAT44(local_118._4_4_,(uint)local_118 + 8);
            ppvVar7 = (void **)((long)local_e8 + uVar5);
          }
          else {
            ppvVar7 = local_110;
            local_110 = local_110 + 1;
          }
          *(void **)(*(long *)(MshIdx + 0x300428) + (long)iVar4) = *ppvVar7;
LAB_0010962e:
          iVar4 = iVar4 + 8;
        }
        else if (cVar2 == 'r') {
          if (*(int *)(MshIdx + 0x18) != 0x20) {
            uVar5 = (ulong)local_118._4_4_;
            if (uVar5 < 0xa1) {
              local_118 = CONCAT44(local_118._4_4_ + 0x10,(uint)local_118);
              ppvVar7 = (void **)((long)local_e8 + uVar5);
            }
            else {
              ppvVar7 = local_110;
              local_110 = local_110 + 1;
            }
            *(void **)(*(long *)(MshIdx + 0x300428) + (long)iVar4) = *ppvVar7;
            goto LAB_0010962e;
          }
          uVar5 = (ulong)local_118._4_4_;
          if (uVar5 < 0xa1) {
            local_118 = CONCAT44(local_118._4_4_ + 0x10,(uint)local_118);
            ppvVar7 = (void **)((long)local_e8 + uVar5);
          }
          else {
            ppvVar7 = local_110;
            local_110 = local_110 + 1;
          }
          *(float *)(*(long *)(MshIdx + 0x300428) + (long)iVar4) = (float)(double)*ppvVar7;
LAB_0010960b:
          iVar4 = iVar4 + 4;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)puVar16[3]);
    }
    break;
  case 3:
    if (*(int *)(MshIdx + 0x18) == 0x20) {
      if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
        if (0 < (int)puVar16[3]) {
          lVar8 = 0;
          do {
            fprintf(*(FILE **)(MshIdx + 0x300410),"%.9g ",SUB84((double)(float)puVar10[lVar8],0));
            lVar8 = lVar8 + 1;
          } while (lVar8 < (int)puVar16[3]);
        }
        goto switchD_00109489_default;
      }
    }
    else if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
      if (0 < (int)puVar16[3]) {
        lVar8 = 0;
        do {
          fprintf(*(FILE **)(MshIdx + 0x300410),"%.17g ",(int)*(undefined8 *)(puVar10 + lVar8 * 2));
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)puVar16[3]);
      }
      goto switchD_00109489_default;
    }
    goto LAB_001099b3;
  case 5:
    iVar4 = puVar16[3];
    if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
      if (0 < iVar4) {
        lVar9 = 0;
        do {
          cVar2 = *(char *)((long)puVar16 + lVar9 + 0xfd8);
          if (cVar2 == 'i') {
            if (*(int *)(MshIdx + 4) < 4) {
              if ((""[(uint)KwdCod] == '\0') || (lVar9 < iVar4 + -1)) {
                pFVar12 = *(FILE **)(MshIdx + 0x300410);
                uVar3 = puVar10[lVar9];
              }
              else {
                pFVar12 = *(FILE **)(MshIdx + 0x300410);
                uVar3 = *puVar14;
              }
              fprintf(pFVar12,"%d ",(ulong)uVar3);
            }
            else {
              if ((""[(uint)KwdCod] == '\0') || (lVar9 < iVar4 + -1)) {
                pFVar12 = *(FILE **)(MshIdx + 0x300410);
                uVar3 = puVar10[lVar9];
              }
              else {
                pFVar12 = *(FILE **)(MshIdx + 0x300410);
                uVar3 = *puVar14;
              }
              fprintf(pFVar12,"%ld ",(long)(int)uVar3);
            }
          }
          else if (cVar2 == 'r') {
            dVar1 = *(double *)(lVar8 + lVar9 * 8);
            uVar17 = SUB84(dVar1,0);
            if (*(int *)(MshIdx + 0x18) == 0x20) {
              pFVar12 = *(FILE **)(MshIdx + 0x300410);
              uVar17 = SUB84((double)(float)dVar1,0);
              pcVar11 = "%.9g ";
            }
            else {
              pFVar12 = *(FILE **)(MshIdx + 0x300410);
              pcVar11 = "%.17g ";
            }
            fprintf(pFVar12,pcVar11,uVar17);
          }
          lVar9 = lVar9 + 1;
          iVar4 = puVar16[3];
        } while (lVar9 < iVar4);
      }
      goto switchD_00109489_default;
    }
    if (0 < iVar4) {
      uVar15 = 0;
      uVar5 = uVar15;
      do {
        cVar2 = *(char *)((long)puVar16 + uVar15 + 0xfd8);
        iVar13 = (int)uVar5;
        if (cVar2 == 'i') {
          if (*(int *)(MshIdx + 4) < 4) {
            puVar14 = puVar10;
            if ((long)(iVar4 + -1) <= (long)uVar15) {
              puVar14 = local_c8;
            }
            if (""[(uint)KwdCod] == '\0') {
              puVar14 = puVar10;
            }
            *(uint *)(*(long *)(MshIdx + 0x300428) + (long)iVar13) = *puVar14;
            goto LAB_00109955;
          }
          puVar14 = puVar10;
          if ((long)(iVar4 + -1) <= (long)uVar15) {
            puVar14 = local_c8;
          }
          if (""[(uint)KwdCod] == '\0') {
            puVar14 = puVar10;
          }
          *(long *)(*(long *)(MshIdx + 0x300428) + (long)iVar13) = (long)(int)*puVar14;
LAB_00109988:
          uVar5 = (ulong)(iVar13 + 8);
        }
        else if (cVar2 == 'r') {
          dVar1 = *(double *)(local_d0 + uVar15 * 8);
          if (*(int *)(MshIdx + 0x18) != 0x20) {
            *(double *)(*(long *)(MshIdx + 0x300428) + (long)iVar13) = dVar1;
            goto LAB_00109988;
          }
          *(float *)(*(long *)(MshIdx + 0x300428) + (long)iVar13) = (float)dVar1;
LAB_00109955:
          uVar5 = (ulong)(iVar13 + 4);
        }
        uVar15 = uVar15 + 1;
        iVar4 = puVar16[3];
        puVar10 = puVar10 + 1;
      } while ((long)uVar15 < (long)iVar4);
    }
    break;
  default:
    goto switchD_00109489_default;
  }
  puVar10 = *(uint **)(MshIdx + 0x300428);
LAB_001099b3:
  RecBlk((GmfMshSct *)MshIdx,puVar10,puVar16[4]);
switchD_00109489_default:
  if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
    fputc(10,*(FILE **)(MshIdx + 0x300410));
  }
  return 1;
}

Assistant:

int GmfSetLin(int64_t MshIdx, int KwdCod, ...)
{
   char        *str;
   int         i, pos, *IntBuf, err, typ, *IntTab, *RefPtr;
   int64_t     *LngBuf;
   float       *FltSolTab, *FltBuf;
   double      *DblSolTab, *DblBuf, *DblTab;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;

   // Special trick: if the kwd is negative the call come from Fortran
   if(KwdCod < 0)
   {
      // Set Fortran mode ON
      KwdCod = -KwdCod;
      kwd = &msh->KwdTab[ KwdCod ];
      typ = F77Kwd;
   }
   else
   {
      kwd = &msh->KwdTab[ KwdCod ];
      typ = kwd->typ;
   }

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);
 
   // Save the current stack environment for longjmp
   // This is needed in RecBlk()
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      return(0);
   }

   // Save the current stack environment for longjmp
   // This is needed in RecBlk()
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      return(0);
   }

   // Start decoding the arguments
   va_start(VarArg, KwdCod);

   switch(typ)
   {
      case InfKwd : case RegKwd : case CmtKwd :
      {
         if(msh->typ & Asc)
         {
            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                     fprintf(msh->hdl, "%.9g ", va_arg(VarArg, double));
                  else
                     fprintf(msh->hdl, "%.17g ", va_arg(VarArg, double));
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                     fprintf(msh->hdl, "%d ", va_arg(VarArg, int));
                  else
                  {
                     // [Bruno] %ld -> INT64_T_FMT
                     fprintf(msh->hdl, INT64_T_FMT " ", va_arg(VarArg, int64_t));
                  }
               }
               else if(kwd->fmt[i] == 'c')
               {
                  // Safety check: if the string is greater than 64 characters
                  // truncate it with an ending 0
                  str = va_arg(VarArg, char *);

                  if(strlen(str) >= FilStrSiz)
                     str[ FilStrSiz ] = 0;

                  fputs(str, msh->hdl);
               }
            }
         }
         else
         {
            pos = 0;

            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                  {
                     FltBuf = (void *)&msh->buf[ pos ];
                     *FltBuf = (float)va_arg(VarArg, double);
                     pos += 4;
                  }
                  else
                  {
                     DblBuf = (void *)&msh->buf[ pos ];
                     *DblBuf = va_arg(VarArg, double);
                     pos += 8;
                  }
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                  {
                     IntBuf = (void *)&msh->buf[ pos ];
                     *IntBuf = va_arg(VarArg, int);
                     pos += 4;
                  }
                  else
                  {
                     LngBuf = (void *)&msh->buf[ pos ];
                     *LngBuf = va_arg(VarArg, int64_t);
                     pos += 8;
                  }
               }
               else if(kwd->fmt[i] == 'c')
               {
                  memset(&msh->buf[ pos ], 0, FilStrSiz * WrdSiz);
                  strncpy(&msh->buf[ pos ], va_arg(VarArg, char *), FilStrSiz * WrdSiz);
                  pos += FilStrSiz;
               }
            }

            RecBlk(msh, msh->buf, kwd->NmbWrd);
         }
      }break;

      case SolKwd :
      {
         if(msh->FltSiz == 32)
         {
            FltSolTab = va_arg(VarArg, float *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  fprintf(msh->hdl, "%.9g ", (double)FltSolTab[i]);
            else
               RecBlk(msh, (unsigned char *)FltSolTab, kwd->NmbWrd);
         }
         else
         {
            DblSolTab = va_arg(VarArg, double *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  fprintf(msh->hdl, "%.17g ", DblSolTab[i]);
            else
               RecBlk(msh, (unsigned char *)DblSolTab, kwd->NmbWrd);
         }
      }break;

      case F77Kwd :
      {
         IntTab = va_arg(VarArg, int *);
         DblTab = va_arg(VarArg, double *);
         RefPtr = va_arg(VarArg, int *);

         if(msh->typ & Asc)
         {
            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                     fprintf(msh->hdl, "%.9g ", (float)DblTab[i]);
                  else
                     fprintf(msh->hdl, "%.17g ", DblTab[i]);
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        fprintf(msh->hdl, "%d ", IntTab[i]);
                     else
                        fprintf(msh->hdl, "%d ", *RefPtr);
                  else
                  {
                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        fprintf(msh->hdl, INT64_T_FMT " ", (int64_t)IntTab[i]);
                     else
                        fprintf(msh->hdl, INT64_T_FMT " ", (int64_t)*RefPtr);
                  }
               }
            }
         }
         else
         {
            pos = 0;

            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                  {
                     FltBuf = (void *)&msh->buf[ pos ];
                     *FltBuf = (float)DblTab[i];
                     pos += 4;
                  }
                  else
                  {
                     DblBuf = (void *)&msh->buf[ pos ];
                     *DblBuf = DblTab[i];
                     pos += 8;
                  }
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                  {
                     IntBuf = (void *)&msh->buf[ pos ];

                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        *IntBuf = IntTab[i];
                     else
                        *IntBuf = *RefPtr;

                     pos += 4;
                  }
                  else
                  {
                     LngBuf = (void *)&msh->buf[ pos ];

                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        *LngBuf = (int64_t)IntTab[i];
                     else
                        *LngBuf = (int64_t)*RefPtr;

                     pos += 8;
                  }
               }
            }

            RecBlk(msh, msh->buf, kwd->NmbWrd);
         }
      }break;
   }

   va_end(VarArg);

   if(msh->typ & Asc)
      fprintf(msh->hdl, "\n");

   return(1);
}